

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

SerializedMessage *
miniros::serialization::serializeMessage<minibag::MessageInstance>
          (SerializedMessage *__return_storage_ptr__,MessageInstance *message)

{
  int iVar1;
  uchar *__p;
  OStream s;
  OStream local_20;
  
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->num_bytes = 0;
  __return_storage_ptr__->message_start = (uint8_t *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->type_info = (type_info *)0x0;
  iVar1 = minibag::MessageInstance::size();
  __return_storage_ptr__->num_bytes = (ulong)(iVar1 + 4);
  __p = (uchar *)operator_new__((ulong)(iVar1 + 4));
  std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
            ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,__p
            );
  local_20.super_Stream.data_ =
       (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_20.super_Stream.end_ =
       local_20.super_Stream.data_ + (__return_storage_ptr__->num_bytes & 0xffffffff);
  Serializer<unsigned_int>::write<miniros::serialization::OStream>
            (&local_20,(int)__return_storage_ptr__->num_bytes - 4);
  __return_storage_ptr__->message_start = local_20.super_Stream.data_;
  minibag::MessageInstance::write<miniros::serialization::OStream>(message,&local_20);
  return __return_storage_ptr__;
}

Assistant:

inline SerializedMessage serializeMessage(const M& message)
{
  SerializedMessage m;
  uint32_t len = serializationLength(message);
  m.num_bytes = len + 4;
  m.buf.reset(new uint8_t[m.num_bytes]);

  OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
  serialize(s, static_cast<uint32_t>(m.num_bytes) - 4);
  m.message_start = s.getData();
  serialize(s, message);

  return m;
}